

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

ostream * doctest::Color::operator<<(ostream *s,Enum code)

{
  Enum code_local;
  ostream *s_local;
  
  anon_unknown_14::color_to_stream(s,code);
  return s;
}

Assistant:

std::ostream& operator<<(std::ostream& s, Color::Enum code) {
        color_to_stream(s, code);
        return s;
    }